

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::BitwiseXor(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                     uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                     uint32_t width,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  uint *puVar2;
  byte *pbVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  byte *pbVar11;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  long lVar12;
  byte *pbVar13;
  uchar *puVar14;
  undefined4 in_register_0000008c;
  uint uVar15;
  uint uVar16;
  uchar *puVar17;
  uchar *puVar18;
  byte *pbVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  uint32_t local_b0;
  uint32_t local_ac;
  ImageTemplate<unsigned_char> *local_a8;
  uint local_9c;
  Image *local_98;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_0000008c,startY2);
  local_90 = CONCAT44(in_register_00000014,startY1);
  local_a8 = in2;
  local_b0 = width;
  while( true ) {
    local_ac = height;
    bVar10 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                       (in1,local_a8,out);
    local_9c = 0;
    if (simdType < 4) {
      local_9c = *(uint *)(&DAT_001ddb20 + (ulong)simdType * 4);
    }
    if (simdType == cpu_function) break;
    if (local_9c <= local_b0 * bVar10) {
      local_98 = in1;
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in1,startX1,(uint32_t)local_90,local_a8,startX2,(uint32_t)local_88,out,startXOut,
                 startYOut,local_b0,local_ac);
      local_b0 = local_b0 * bVar10;
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_58._data = (uchar *)0x0;
      local_58._type = local_a8->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)local_a8,src);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_80._data = (uchar *)0x0;
      local_80._type = out->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_b0,&local_ac,local_98,&local_58,&local_80);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      uVar5 = in1->_rowSize;
      uVar6 = local_a8->_rowSize;
      uVar7 = out->_rowSize;
      uVar8 = (ulong)local_b0 / (ulong)local_9c;
      uVar9 = (ulong)local_b0 % (ulong)local_9c;
      uVar15 = (uint)bVar10;
      puVar18 = in1->_data + (ulong)(startX1 * uVar15) + (ulong)((int)local_90 * uVar5);
      puVar14 = local_a8->_data + (ulong)(startX2 * uVar15) + (ulong)((int)local_88 * uVar6);
      puVar17 = out->_data + (ulong)(startXOut * uVar15) + (ulong)(startYOut * uVar7);
      uVar16 = local_ac * uVar7;
      puVar1 = puVar17 + uVar16;
      uVar15 = (int)uVar8 * local_9c;
      if (simdType == sse_function) {
        if (uVar16 == 0) {
          return;
        }
        do {
          if (local_9c <= local_b0) {
            lVar12 = 0;
            do {
              puVar2 = (uint *)(puVar14 + lVar12);
              puVar4 = puVar18 + lVar12 + 0x10;
              auVar20._0_4_ = *puVar2 ^ *(uint *)(puVar4 + -0x10);
              auVar20._4_4_ = puVar2[1] ^ *(uint *)(puVar4 + -0xc);
              auVar20._8_4_ = puVar2[2] ^ *(uint *)(puVar4 + -8);
              auVar20._12_4_ = puVar2[3] ^ *(uint *)(puVar4 + -4);
              *(undefined1 (*) [16])(puVar17 + lVar12) = auVar20;
              lVar12 = lVar12 + 0x10;
            } while (puVar4 != puVar18 + uVar8 * 0x10);
          }
          if (local_b0 != uVar15) {
            pbVar19 = puVar17 + uVar15;
            pbVar3 = pbVar19 + uVar9;
            pbVar13 = puVar14 + uVar15;
            pbVar11 = puVar18 + uVar15;
            do {
              *pbVar19 = *pbVar13 ^ *pbVar11;
              pbVar19 = pbVar19 + 1;
              pbVar11 = pbVar11 + 1;
              pbVar13 = pbVar13 + 1;
            } while (pbVar19 != pbVar3);
          }
          puVar17 = puVar17 + uVar7;
          puVar18 = puVar18 + uVar5;
          puVar14 = puVar14 + uVar6;
        } while (puVar17 != puVar1);
        return;
      }
      if (simdType != avx_function) {
        return;
      }
      if (uVar16 == 0) {
        return;
      }
      do {
        if (local_9c <= local_b0) {
          lVar12 = 0;
          do {
            puVar2 = (uint *)(puVar14 + lVar12);
            puVar4 = puVar18 + lVar12 + 0x20;
            auVar21._0_4_ = *puVar2 ^ *(uint *)(puVar4 + -0x20);
            auVar21._4_4_ = puVar2[1] ^ *(uint *)(puVar4 + -0x1c);
            auVar21._8_4_ = puVar2[2] ^ *(uint *)(puVar4 + -0x18);
            auVar21._12_4_ = puVar2[3] ^ *(uint *)(puVar4 + -0x14);
            auVar21._16_4_ = puVar2[4] ^ *(uint *)(puVar4 + -0x10);
            auVar21._20_4_ = puVar2[5] ^ *(uint *)(puVar4 + -0xc);
            auVar21._24_4_ = puVar2[6] ^ *(uint *)(puVar4 + -8);
            auVar21._28_4_ = puVar2[7] ^ *(uint *)(puVar4 + -4);
            *(undefined1 (*) [32])(puVar17 + lVar12) = auVar21;
            lVar12 = lVar12 + 0x20;
          } while (puVar4 != puVar18 + uVar8 * 0x20);
        }
        if (local_b0 != uVar15) {
          pbVar19 = puVar17 + uVar15;
          pbVar3 = pbVar19 + uVar9;
          pbVar13 = puVar14 + uVar15;
          pbVar11 = puVar18 + uVar15;
          do {
            *pbVar19 = *pbVar13 ^ *pbVar11;
            pbVar19 = pbVar19 + 1;
            pbVar11 = pbVar11 + 1;
            pbVar13 = pbVar13 + 1;
          } while (pbVar19 != pbVar3);
        }
        puVar17 = puVar17 + uVar7;
        puVar18 = puVar18 + uVar5;
        puVar14 = puVar14 + uVar6;
      } while (puVar17 != puVar1);
      return;
    }
    if (simdType != avx_function) break;
    simdType = sse_function;
    height = local_ac;
  }
  Image_Function::BitwiseXor
            (in1,startX1,(uint32_t)local_90,local_a8,startX2,(uint32_t)local_88,out,startXOut,
             startYOut,local_b0,local_ac);
  return;
}

Assistant:

void BitwiseXor( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                     Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseXor( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }